

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O2

int Gia_WinTryAddingNode(Gia_Man_t *p,int iPivot,int iPivot2,Vec_Wec_t *vLevels,Vec_Int_t *vNodes)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int Entry;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pObj;
  int iVar7;
  int local_54;
  
  iVar2 = Vec_WecSizeSize(vLevels);
  if (iVar2 != 0) {
    __assert_fail("Vec_WecSizeSize(vLevels) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x23e,"int Gia_WinTryAddingNode(Gia_Man_t *, int, int, Vec_Wec_t *, Vec_Int_t *)"
                 );
  }
  iVar2 = Gia_ObjIsTravIdCurrentId(p,iPivot);
  if (iVar2 != 0) {
    __assert_fail("!Gia_ObjIsTravIdCurrentId(p, iPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x240,"int Gia_WinTryAddingNode(Gia_Man_t *, int, int, Vec_Wec_t *, Vec_Int_t *)"
                 );
  }
  Gia_ObjSetTravIdCurrentId(p,iPivot);
  iVar2 = Gia_ObjLevelId(p,iPivot);
  Vec_WecPush(vLevels,iVar2,iPivot);
  if (iPivot2 != -1) {
    iVar2 = Gia_ObjIsTravIdCurrentId(p,iPivot2);
    if (iVar2 != 0) {
      __assert_fail("!Gia_ObjIsTravIdCurrentId(p, iPivot2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                    ,0x248,
                    "int Gia_WinTryAddingNode(Gia_Man_t *, int, int, Vec_Wec_t *, Vec_Int_t *)");
    }
    Gia_ObjSetTravIdCurrentId(p,iPivot2);
    iVar2 = Gia_ObjLevelId(p,iPivot2);
    Vec_WecPush(vLevels,iVar2,iPivot2);
  }
  iVar2 = 0;
  local_54 = 0;
  do {
    iVar7 = vLevels->nSize;
    if (iVar7 <= iVar2) {
      iVar2 = 0;
      do {
        if (iVar7 <= iVar2) {
          return local_54;
        }
        pVVar5 = Vec_WecEntry(vLevels,iVar2);
        for (iVar7 = 0; iVar7 < pVVar5->nSize; iVar7 = iVar7 + 1) {
          iVar3 = Vec_IntEntry(pVVar5,iVar7);
          pGVar6 = Gia_ManObj(p,iVar3);
          if (pGVar6 == (Gia_Obj_t *)0x0) break;
          if (vNodes == (Vec_Int_t *)0x0) {
            iVar3 = Gia_ObjId(p,pGVar6);
            if (p->nTravIdsAlloc <= iVar3) {
              __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x263,"void Gia_ObjSetTravIdPrevious(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar3 = p->nTravIds;
            piVar1 = p->pTravIds;
            iVar4 = Gia_ObjId(p,pGVar6);
            piVar1[iVar4] = iVar3 + -1;
          }
          else {
            iVar3 = Gia_ObjId(p,pGVar6);
            Vec_IntPush(vNodes,iVar3);
          }
        }
        pVVar5->nSize = 0;
        iVar2 = iVar2 + 1;
        iVar7 = vLevels->nSize;
      } while( true );
    }
    pVVar5 = Vec_WecEntry(vLevels,iVar2);
    for (iVar7 = 0; iVar7 < pVVar5->nSize; iVar7 = iVar7 + 1) {
      iVar3 = Vec_IntEntry(pVVar5,iVar7);
      pGVar6 = Gia_ManObj(p,iVar3);
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      iVar3 = 0;
      while( true ) {
        iVar4 = Gia_ObjFanoutNum(p,pGVar6);
        if (iVar4 <= iVar3) break;
        pObj = Gia_ObjFanout(p,pGVar6,iVar3);
        if (iVar3 == 5) break;
        if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
          iVar4 = Gia_ObjIsTravIdCurrent(p,pObj);
          if (iVar4 == 0) {
            iVar4 = Gia_ObjIsTravIdCurrent
                              (p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff));
            if (iVar4 != 0) {
              iVar4 = Gia_ObjIsTravIdCurrent
                                (p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
              if (iVar4 != 0) {
                Gia_ObjSetTravIdCurrent(p,pObj);
                iVar4 = Gia_ObjLevel(p,pObj);
                Entry = Gia_ObjId(p,pObj);
                Vec_WecPush(vLevels,iVar4,Entry);
                local_54 = local_54 + 1;
              }
            }
          }
        }
        iVar3 = iVar3 + 1;
      }
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

int Gia_WinTryAddingNode( Gia_Man_t * p, int iPivot, int iPivot2, Vec_Wec_t * vLevels, Vec_Int_t * vNodes )
{
    Vec_Int_t * vLevel; 
    Gia_Obj_t * pObj, * pFanout;
    int k, i, f, Count = 0;
    // precondition:  the levelized structure is empty
    assert( Vec_WecSizeSize(vLevels) == 0 );
    // precondition:  the new object to be added (iPivot) is not in the window
    assert( !Gia_ObjIsTravIdCurrentId(p, iPivot) );
    // add the object to the window and to the levelized structure
    Gia_ObjSetTravIdCurrentId( p, iPivot );
    Vec_WecPush( vLevels, Gia_ObjLevelId(p, iPivot), iPivot );
    // the same about the second node if it is given
    if ( iPivot2 != -1 )
    {
        // precondition:  the new object to be added (iPivot2) is not in the window
        assert( !Gia_ObjIsTravIdCurrentId(p, iPivot2) );
        // add the object to the window and to the levelized structure
        Gia_ObjSetTravIdCurrentId( p, iPivot2 );
        Vec_WecPush( vLevels, Gia_ObjLevelId(p, iPivot2), iPivot2 );
    }
    // iterate through all objects and explore their fanouts
    Vec_WecForEachLevel( vLevels, vLevel, k )
        Gia_ManForEachObjVec( vLevel, p, pObj, i )
            Gia_ObjForEachFanoutStatic( p, pObj, pFanout, f )
            {
                if ( f == 5 ) // explore first 5 fanouts of the node
                    break;
                if ( Gia_ObjIsAnd(pFanout) && // internal node
                    !Gia_ObjIsTravIdCurrent(p, pFanout) && // not in the window
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin0(pFanout)) && // but fanins are
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin1(pFanout)) )  // in the window
                {
                    // add fanout to the window and to the levelized structure
                    Gia_ObjSetTravIdCurrent( p, pFanout );
                    Vec_WecPush( vLevels, Gia_ObjLevel(p, pFanout), Gia_ObjId(p, pFanout) );
                    // count the number of nodes in the structure
                    Count++;
                }
            }
    // iterate through the nodes in the levelized structure
    Vec_WecForEachLevel( vLevels, vLevel, k )
    {
        Gia_ManForEachObjVec( vLevel, p, pObj, i )
            if ( vNodes == NULL ) // it was a test run - unmark the node
                Gia_ObjSetTravIdPrevious( p, pObj );
            else // it was a real run - permanently add to the node to the window
                Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        // clean the levelized structure
        Vec_IntClear( vLevel );
    }
    // return the number of nodes to be added
    return Count;
}